

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O0

ClassArray<soplex::Nonzero<double>_> * __thiscall
soplex::ClassArray<soplex::Nonzero<double>_>::operator=
          (ClassArray<soplex::Nonzero<double>_> *this,ClassArray<soplex::Nonzero<double>_> *rhs)

{
  Nonzero<double> *pNVar1;
  Nonzero<double> *pNVar2;
  int iVar3;
  ClassArray<soplex::Nonzero<double>_> *in_RSI;
  ClassArray<soplex::Nonzero<double>_> *in_RDI;
  int i;
  int in_stack_ffffffffffffffdc;
  int iVar4;
  int local_14;
  
  if (in_RDI != in_RSI) {
    size(in_RSI);
    reSize(in_RDI,in_stack_ffffffffffffffdc);
    local_14 = 0;
    while (iVar4 = local_14, iVar3 = size(in_RDI), iVar4 < iVar3) {
      pNVar1 = in_RSI->data;
      pNVar2 = in_RDI->data;
      pNVar2[local_14].val = pNVar1[local_14].val;
      pNVar2[local_14].idx = pNVar1[local_14].idx;
      local_14 = local_14 + 1;
    }
  }
  return in_RDI;
}

Assistant:

ClassArray& operator=(const ClassArray& rhs)
   {
      if(this != &rhs)
      {
         reSize(rhs.size());

         for(int i = 0; i < size(); i++)
            data[i] = rhs.data[i];

         assert(isConsistent());
      }

      return *this;
   }